

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>::format
          (short_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  long in_RSI;
  scoped_padder *in_RDI;
  scoped_padder p;
  size_t text_size;
  char *filename;
  char *s;
  memory_buf_t *in_stack_ffffffffffffff88;
  memory_buf_t *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  scoped_padder *in_stack_ffffffffffffffa0;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (!bVar1) {
    basename(*(char **)(in_RSI + 0x38));
    bVar1 = padding_info::enabled((padding_info *)&in_RDI->dest_);
    if (bVar1) {
      s = (char *)std::char_traits<char>::length((char_type *)0x2433f5);
    }
    else {
      s = (char *)0x0;
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
               (padding_info *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    ::fmt::v6::basic_string_view<char>::basic_string_view((basic_string_view<char> *)in_RDI,s);
    view.size_ = (size_t)in_stack_ffffffffffffffa0;
    view.data_ = in_stack_ffffffffffffff98;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffff90);
    scoped_padder::~scoped_padder(in_RDI);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }